

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerGL::TextureBindInfo::BindResource
          (TextureBindInfo *this,BindResourceInfo *BindInfo)

{
  ResourceCacheContentType RVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  Uint32 UVar3;
  PipelineResourceDesc *ResDesc;
  Char *pCVar4;
  CachedResourceView *pCVar5;
  TextureViewGLImpl *BindInfo_00;
  IDeviceObject *pIVar6;
  PipelineResourceSignatureDesc *pPVar7;
  BufferViewGLImpl *pBVar8;
  char (*in_R8) [41];
  bool bVar9;
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  char *in_stack_fffffffffffffe20;
  Char *local_140;
  undefined1 local_138 [8];
  string msg_4;
  string msg_3;
  CachedResourceView *CachedBuffSampler;
  RefCntAutoPtr<Diligent::BufferViewGLImpl> pViewGL_1;
  string msg_2;
  string msg_1;
  CachedResourceView *CachedTexSampler;
  bool ImmutableSamplerAssigned;
  RefCntAutoPtr<Diligent::TextureViewGLImpl> pViewGL;
  ShaderResourceCacheType *ResourceCache;
  undefined1 local_48 [8];
  string msg;
  ResourceAttribs *Attr;
  PipelineResourceDesc *Desc;
  BindResourceInfo *BindInfo_local;
  TextureBindInfo *this_local;
  
  ResDesc = ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
            ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                       *)this);
  msg.field_2._8_8_ =
       GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>::GetAttribs
                 (&this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>);
  if (ResDesc->ArraySize <= BindInfo->ArrayIndex) {
    FormatString<char[89]>
              ((string *)local_48,
               (char (*) [89])
               "Index is out of range, but it should\'ve been corrected by ShaderVariableBase::SetArray()"
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0xe8);
    std::__cxx11::string::~string((string *)local_48);
  }
  pViewGL.m_pObject =
       (TextureViewGLImpl *)
       (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>).
         super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
        .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
       m_ResourceCache;
  if ((ResDesc->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV) ||
     (ResDesc->ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT)) {
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&stack0xffffffffffffff98,
               &BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_TextureViewGL);
    UVar3 = PipelineResourceSignatureGLImpl::GetImmutableSamplerIdx
                      ((((this->
                         super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>).
                         super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                        .m_ParentManager)->
                       super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                       m_pSignature,(ResourceAttribs *)msg.field_2._8_8_);
    bVar9 = UVar3 != 0xffffffff;
    pCVar5 = ShaderResourceCacheGL::GetConstTexture
                       ((ShaderResourceCacheGL *)pViewGL.m_pObject,
                        *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex);
    BindInfo_00 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::RawPtr
                            ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&stack0xffffffffffffff98)
    ;
    msg_1.field_2._M_local_buf[0xf] = '\x01';
    pIVar6 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(&pCVar5->pView);
    pPVar7 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)(((this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                            ).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                           .m_ParentManager)->
                          super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                          m_pSignature);
    VerifyResourceViewBinding<Diligent::TextureViewGLImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,(BindResourceInfo *)BindInfo_00,
               (TextureViewGLImpl *)((long)&msg_1.field_2 + 0xf),
               (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
               SUB81(pIVar6,0),(IDeviceObject *)(pPVar7->super_DeviceObjectAttribs).Name,
               in_stack_fffffffffffffe20);
    if ((bVar9) &&
       ((RVar1 = ShaderResourceCacheGL::GetContentType((ShaderResourceCacheGL *)pViewGL.m_pObject),
        RVar1 == SRB && ((pCVar5->field_2).pBuffer == (BufferGLImpl *)0x0)))) {
      FormatString<char[114]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [114])
                 "Immutable samplers must be initialized in the SRB cache by PipelineResourceSignatureGLImpl::InitSRBResourceCache!"
                );
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0xfd);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if ((ResDesc->ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT) && (bVar9)) {
      FormatString<char[49]>
                ((string *)&pViewGL_1,
                 (char (*) [49])"Input attachment must not have assigned sampler.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x101);
      std::__cxx11::string::~string((string *)&pViewGL_1);
    }
    ShaderResourceCacheGL::SetTexture
              ((ShaderResourceCacheGL *)pViewGL.m_pObject,
               *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex,
               (RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&stack0xffffffffffffff98,
               (bool)(~bVar9 & 1));
    RefCntAutoPtr<Diligent::TextureViewGLImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::TextureViewGLImpl> *)&stack0xffffffffffffff98);
  }
  else if (ResDesc->ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV) {
    RefCntAutoPtr<Diligent::BufferViewGLImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedBuffSampler,
               &BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_BufferViewGL);
    pCVar5 = ShaderResourceCacheGL::GetConstTexture
                       ((ShaderResourceCacheGL *)pViewGL.m_pObject,
                        *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex);
    pBVar8 = RefCntAutoPtr<Diligent::BufferViewGLImpl>::RawPtr
                       ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedBuffSampler);
    msg_3.field_2._M_local_buf[0xf] = '\x01';
    pIVar6 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(&pCVar5->pView);
    pPVar7 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)(((this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                            ).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                           .m_ParentManager)->
                          super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                          m_pSignature);
    ExpectedViewTypes._M_len = 1;
    ExpectedViewTypes._M_array = (iterator)0x1;
    VerifyResourceViewBinding<Diligent::BufferViewGLImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,(BindResourceInfo *)pBVar8,
               (BufferViewGLImpl *)((long)&msg_3.field_2 + 0xf),ExpectedViewTypes,
               RESOURCE_DIM_UNDEFINED,SUB81(pIVar6,0),
               (IDeviceObject *)(pPVar7->super_DeviceObjectAttribs).Name,in_stack_fffffffffffffe20);
    PVar2 = Diligent::operator&(ResDesc->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
    if (PVar2 == PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[92]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [92])
                 "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should\'ve not happened."
                );
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BindResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x116);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    UVar3 = BindInfo->ArrayIndex;
    pBVar8 = RefCntAutoPtr<Diligent::BufferViewGLImpl>::RawPtr
                       ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedBuffSampler);
    ValidateBufferMode<Diligent::BufferViewGLImpl>(ResDesc,UVar3,pBVar8);
    ShaderResourceCacheGL::SetTexelBuffer
              ((ShaderResourceCacheGL *)pViewGL.m_pObject,
               *(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex,
               (RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedBuffSampler);
    RefCntAutoPtr<Diligent::BufferViewGLImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedBuffSampler);
  }
  else {
    local_140 = GetShaderResourceTypeLiteralName(ResDesc->ResourceType,false);
    FormatString<char[26],char_const*,char[41]>
              ((string *)local_138,(Diligent *)"Unexpected resource type ",(char (*) [26])&local_140
               ,(char **)". Texture SRV or buffer SRV is expected.",in_R8);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x11e);
    std::__cxx11::string::~string((string *)local_138);
  }
  return;
}

Assistant:

void ShaderVariableManagerGL::TextureBindInfo::BindResource(const BindResourceInfo& BindInfo)
{
    const auto& Desc = GetDesc();
    const auto& Attr = GetAttribs();

    VERIFY(BindInfo.ArrayIndex < Desc.ArraySize, "Index is out of range, but it should've been corrected by ShaderVariableBase::SetArray()");
    auto& ResourceCache = m_ParentManager.m_ResourceCache;

    if (Desc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV ||
        Desc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<TextureViewGLImpl> pViewGL{BindInfo.pObject, IID_TextureViewGL};

        const auto ImmutableSamplerAssigned = (m_ParentManager.m_pSignature->GetImmutableSamplerIdx(Attr) != InvalidImmutableSamplerIndex);
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedTexSampler = ResourceCache.GetConstTexture(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {TEXTURE_VIEW_SHADER_RESOURCE}, // Expected view type
                                      RESOURCE_DIM_UNDEFINED,         // Expected resource dimension - unknown at this point
                                      false,                          // IsMultisample (ignored when resource dim is undefined)
                                      CachedTexSampler.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);
            if (ImmutableSamplerAssigned && ResourceCache.GetContentType() == ResourceCacheContentType::SRB)
            {
                VERIFY(CachedTexSampler.pSampler != nullptr, "Immutable samplers must be initialized in the SRB cache by PipelineResourceSignatureGLImpl::InitSRBResourceCache!");
            }
            if (Desc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT)
            {
                DEV_CHECK_ERR(!ImmutableSamplerAssigned, "Input attachment must not have assigned sampler.");
            }
        }
#endif
        ResourceCache.SetTexture(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL), !ImmutableSamplerAssigned);
    }
    else if (Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV)
    {
        // We cannot use ClassPtrCast<> here as the resource can be of wrong type
        RefCntAutoPtr<BufferViewGLImpl> pViewGL{BindInfo.pObject, IID_BufferViewGL};
#ifdef DILIGENT_DEVELOPMENT
        {
            const auto& CachedBuffSampler = ResourceCache.GetConstTexture(Attr.CacheOffset + BindInfo.ArrayIndex);
            VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                      {BUFFER_VIEW_SHADER_RESOURCE}, // Expected view type
                                      RESOURCE_DIM_BUFFER,           // Expected resource dimension
                                      false,                         // IsMultisample (ignored when resource dim is buffer)
                                      CachedBuffSampler.pView.RawPtr(),
                                      m_ParentManager.m_pSignature->GetDesc().Name);

            VERIFY((Desc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0,
                   "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should've not happened.");
            ValidateBufferMode(Desc, BindInfo.ArrayIndex, pViewGL.RawPtr());
        }
#endif
        ResourceCache.SetTexelBuffer(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
    }
    else
    {
        UNEXPECTED("Unexpected resource type ", GetShaderResourceTypeLiteralName(Desc.ResourceType), ". Texture SRV or buffer SRV is expected.");
    }
}